

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent_coop_notifications.cpp
# Opt level: O2

coop_reg_notificator_t * __thiscall
so_5::make_coop_reg_notificator_abi_cxx11_
          (coop_reg_notificator_t *__return_storage_ptr__,so_5 *this,mbox_t *mbox)

{
  long *plVar1;
  intrusive_ptr_t<so_5::abstract_message_box_t> local_18;
  
  local_18.m_obj = *(abstract_message_box_t **)this;
  if (local_18.m_obj != (abstract_message_box_t *)0x0) {
    LOCK();
    ((local_18.m_obj)->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>.
    _M_i = ((local_18.m_obj)->super_atomic_refcounted_t).m_ref_counter.
           super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  plVar1 = (long *)operator_new(8);
  *plVar1 = (long)local_18.m_obj;
  if (local_18.m_obj != (abstract_message_box_t *)0x0) {
    LOCK();
    ((local_18.m_obj)->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>.
    _M_i = ((local_18.m_obj)->super_atomic_refcounted_t).m_ref_counter.
           super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  *(long **)&(__return_storage_ptr__->super__Function_base)._M_functor = plVar1;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(so_5::environment_t_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/agent_coop_notifications.cpp:49:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(so_5::environment_t_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/agent_coop_notifications.cpp:49:10)>
       ::_M_manager;
  intrusive_ptr_t<so_5::abstract_message_box_t>::~intrusive_ptr_t(&local_18);
  return __return_storage_ptr__;
}

Assistant:

SO_5_FUNC coop_reg_notificator_t
make_coop_reg_notificator(
	const mbox_t & mbox )
	{
		return [mbox](
				environment_t &,
				const std::string & coop_name )
				{
					mbox->deliver_message( new msg_coop_registered( coop_name ) );
				};
	}